

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O3

void google::protobuf::compiler::java::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  bool bVar1;
  string local_d0;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  undefined1 local_48 [32];
  
  io::Printer::Print<>(printer,"/**\n");
  local_b0._24_8_ = 0;
  local_90._M_local_buf[0] = '\0';
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._16_8_ = &local_90;
  local_80._M_p = (pointer)&local_70;
  bVar1 = MethodDescriptor::GetSourceLocation(method,(SourceLocation *)local_b0);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._16_8_ != &local_90) {
    operator_delete((void *)local_b0._16_8_);
  }
  MethodDescriptor::DebugString_abi_cxx11_((string *)local_48,method);
  FirstLineOf(&local_d0,(java *)local_48._0_8_,(string *)local_48._8_8_);
  EscapeJavadoc((string *)local_b0,&local_d0);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * <code>$def$</code>\n */\n",(char (*) [4])0x3e0b21,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((java *)local_48._0_8_ != (java *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer,
                           const MethodDescriptor* method) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, method);
  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(method->DebugString())));
}